

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

bool __thiscall
slang::parsing::Preprocessor::shouldTakeElseBranch
          (Preprocessor *this,SourceLocation location,ConditionalDirectiveExpressionSyntax *expr)

{
  size_type sVar1;
  pointer pBVar2;
  bool bVar3;
  byte bVar4;
  
  sVar1 = (this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.len;
  if (sVar1 != 0) {
    pBVar2 = (this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.
             data_;
    if (pBVar2[sVar1 - 1].hasElse != true) {
      bVar4 = pBVar2[sVar1 - 1].anyTaken;
      if (((bool)bVar4 == false) && ((sVar1 == 1 || (pBVar2[sVar1 - 2].currentActive == true)))) {
        if (expr == (ConditionalDirectiveExpressionSyntax *)0x0) {
          bVar3 = true;
        }
        else {
          bVar3 = evalConditionalExpr(this,expr);
          bVar4 = pBVar2[sVar1 - 1].anyTaken;
        }
      }
      else {
        bVar3 = false;
      }
      pBVar2[sVar1 - 1].currentActive = bVar3;
      pBVar2[sVar1 - 1].anyTaken = (bool)(bVar4 | bVar3);
      pBVar2[sVar1 - 1].hasElse = expr == (ConditionalDirectiveExpressionSyntax *)0x0;
      return bVar3;
    }
  }
  addDiag(this,(DiagCode)0x190004,location);
  return true;
}

Assistant:

bool Preprocessor::shouldTakeElseBranch(SourceLocation location,
                                        const syntax::ConditionalDirectiveExpressionSyntax* expr) {
    // empty stack is an error
    if (branchStack.empty()) {
        addDiag(diag::UnexpectedConditionalDirective, location);
        return true;
    }

    // if we already had an else for this branch, we can't have any more elseifs
    BranchEntry& branch = branchStack.back();
    if (branch.hasElse) {
        addDiag(diag::UnexpectedConditionalDirective, location);
        return true;
    }

    // if part of this branch has already been taken, we can't take this one
    bool taken = false;
    if (!branch.anyTaken) {
        // only take this branch if we're the only one in the stack, or our parent is active
        if (branchStack.size() == 1 || branchStack[branchStack.size() - 2].currentActive)
            taken = !expr || evalConditionalExpr(*expr);
    }

    branch.currentActive = taken;
    branch.anyTaken |= taken;
    branch.hasElse = !expr;
    return taken;
}